

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O0

void __thiscall xray_re::xr_way_object::load(xr_way_object *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint16_t uVar2;
  size_t sVar3;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_way_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar3 = xr_reader::r_chunk<unsigned_short>(r,1,&local_1a);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x1c,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  if (local_1a != 0x13) {
    __assert_fail("version == WAYOBJECT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x1d,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar3 = xr_reader::find_chunk(pxStack_18,2);
  pxVar1 = pxStack_18;
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x22,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  uVar2 = xr_reader::r_u16(pxStack_18);
  xr_reader::
  r_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,read_point_le>
            (pxVar1,uVar2,&this->m_points);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar3 = xr_reader::find_chunk(pxStack_18,3);
  pxVar1 = pxStack_18;
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x27,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  uVar2 = xr_reader::r_u16(pxStack_18);
  xr_reader::
  r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
            (pxVar1,uVar2,&this->m_links);
  xr_reader::debug_find_chunk(pxStack_18);
  xr_reader::r_chunk<unsigned_int>(pxStack_18,4,&this->m_type);
  return;
}

Assistant:

void xr_way_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION);

	xr_custom_object::load(r);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_points, read_point_le());
	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_links, way_link_io());
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(WAYOBJECT_CHUNK_TYPE, m_type);
}